

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_refcount.c
# Opt level: O0

void uo_refcount_dec(uo_refcount *refcount)

{
  atomic_uint_fast32_t *paVar1;
  atomic_uint_fast32_t aVar2;
  uo_refcount_linklist *link;
  uo_refcount *refcount_local;
  
  LOCK();
  paVar1 = &refcount->count;
  aVar2 = *paVar1;
  *paVar1 = *paVar1 - 1;
  UNLOCK();
  if (aVar2 == 1) {
    (*refcount->finalizer)(refcount->ptr);
    link = uo_refcount_get_linklist(refcount);
    uo_refcount_linkpool_return(link);
  }
  return;
}

Assistant:

void uo_refcount_dec(
    uo_refcount *refcount)
{
    if (atomic_fetch_sub(&refcount->count, 1) == 1)
    {
        refcount->finalizer(refcount->ptr);
        uo_refcount_linkpool_return(uo_refcount_get_linklist(refcount));
    }
}